

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCReg expr_list(LexState *ls,ExpDesc *v)

{
  int iVar1;
  BCReg local_1c;
  BCReg n;
  ExpDesc *v_local;
  LexState *ls_local;
  
  local_1c = 1;
  expr(ls,v);
  while( true ) {
    iVar1 = lex_opt(ls,0x2c);
    if (iVar1 == 0) break;
    expr_tonextreg(ls->fs,v);
    expr(ls,v);
    local_1c = local_1c + 1;
  }
  return local_1c;
}

Assistant:

static BCReg expr_list(LexState *ls, ExpDesc *v)
{
  BCReg n = 1;
  expr(ls, v);
  while (lex_opt(ls, ',')) {
    expr_tonextreg(ls->fs, v);
    expr(ls, v);
    n++;
  }
  return n;
}